

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O2

void crnlib::file_utils::combine_path(dynamic_string *dst,char *pA,char *pB)

{
  char *pcVar1;
  dynamic_string temp;
  
  dynamic_string::dynamic_string(&temp,pA);
  if ((temp.m_len != 0) && (*pB != '/')) {
    pcVar1 = "";
    if (temp.m_pStr != (char *)0x0) {
      pcVar1 = temp.m_pStr;
    }
    if (pcVar1[temp.m_len - 1] != '/') {
      dynamic_string::append_char(&temp,'/');
    }
  }
  dynamic_string::append(&temp,pB);
  dynamic_string::swap(dst,&temp);
  dynamic_string::~dynamic_string(&temp);
  return;
}

Assistant:

void file_utils::combine_path(dynamic_string& dst, const char* pA, const char* pB)
    {
        dynamic_string temp(pA);
        if ((!temp.is_empty()) && (!is_path_separator(pB[0])))
        {
            char c = temp[temp.get_len() - 1];
            if (!is_path_separator(c))
            {
                temp.append_char(CRNLIB_PATH_SEPERATOR_CHAR);
            }
        }
        temp += pB;
        dst.swap(temp);
    }